

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  long lVar1;
  code **ppcVar2;
  undefined8 *puVar3;
  byte bVar4;
  http_settings_s in_stack_fffffffffffffef8;
  code *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 local_8;
  
  bVar4 = 0;
  llog_info("LotteHTTP is starting up...");
  HTTP_HEADER_SERVER = fiobj_str_new("server",6);
  HTTP_HEADER_SERVER_VALUE = fiobj_str_new("LotteHTTP/0.9.0",0xf);
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  uStack_10 = 0;
  local_80 = on_request;
  local_8 = 0x10000;
  ppcVar2 = &local_80;
  puVar3 = (undefined8 *)&stack0xfffffffffffffef8;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *ppcVar2;
    ppcVar2 = ppcVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  http_listen("3000",(char *)0x0,in_stack_fffffffffffffef8);
  fio_start((fio_start_args)0x1);
  return 0;
}

Assistant:

int main(void) {
    llog_info("LotteHTTP is starting up...");

    HTTP_HEADER_SERVER = fiobj_str_new("server", strsizeof("server"));
    HTTP_HEADER_SERVER_VALUE = fiobj_str_new("LotteHTTP/0.9.0", strsizeof("LotteHTTP/0.9.0"));

    http_listen("3000", NULL, .on_request = on_request, .log = 1);
    fio_start(.threads = 1);

    return 0;
}